

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool_task.cpp
# Opt level: O2

void __thiscall
Function_Pool::FunctionPoolTask::_setup
          (FunctionPoolTask *this,Image *in,uint32_t startXIn,uint32_t startYIn,uint32_t widthIn,
          uint32_t heightIn,Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t widthOut,
          uint32_t heightOut)

{
  uint32_t width_;
  bool bVar1;
  uint32_t count;
  uint32_t uVar2;
  pointer __p_00;
  pointer __p_01;
  imageException *this_00;
  pointer __p;
  __uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
  local_38;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,widthIn,heightIn);
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (out,startXOut,startYOut,widthOut,heightOut);
  bVar1 = AbstractTaskProvider::_ready((AbstractTaskProvider *)this);
  if (bVar1) {
    __p_00 = (pointer)operator_new(0x68);
    count = anon_unknown.dwarf_af8bd::threadCount();
    uVar2 = heightIn;
    if (heightOut < heightIn) {
      uVar2 = heightOut;
    }
    width_ = widthIn;
    if (widthOut < widthIn) {
      width_ = widthOut;
    }
    AreaInfo::AreaInfo((AreaInfo *)__p_00,startXIn,startYIn,width_,uVar2,count);
    local_38._M_t.
    super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
    .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl =
         (tuple<Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
          )(_Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
            )0x0;
    __p_00->image = in;
    std::
    __uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
    ::reset((__uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             *)&this->_infoIn1,__p_00);
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    ~unique_ptr((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                 *)&local_38);
    __p_01 = (pointer)operator_new(0x68);
    uVar2 = anon_unknown.dwarf_af8bd::threadCount();
    AreaInfo::AreaInfo((AreaInfo *)__p_01,startXOut,startYOut,widthOut,heightOut,uVar2);
    local_38._M_t.
    super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
    .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl =
         (tuple<Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
          )(_Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
            )0x0;
    __p_01->image = out;
    std::
    __uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
    ::reset((__uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             *)&this->_infoOut,__p_01);
    std::
    unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
    ::~unique_ptr((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                   *)&local_38);
    AreaInfo::_copy(&((this->_infoOut)._M_t.
                      super___uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Function_Pool::OutputImageInfo_*,_std::default_delete<Function_Pool::OutputImageInfo>_>
                      .super__Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false>._M_head_impl)
                     ->super_AreaInfo,
                    &((this->_infoIn1)._M_t.
                      super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
                      .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl)->
                     super_AreaInfo,startXOut,startYOut,widthOut,heightOut);
    AreaInfo::_copy(&((this->_infoIn1)._M_t.
                      super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
                      .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl)->
                     super_AreaInfo,
                    &((this->_infoOut)._M_t.
                      super___uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Function_Pool::OutputImageInfo_*,_std::default_delete<Function_Pool::OutputImageInfo>_>
                      .super__Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false>._M_head_impl)
                     ->super_AreaInfo,startXIn,startYIn,widthIn,heightIn);
    return;
  }
  this_00 = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this_00,"FunctionTask object was called multiple times!");
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void FunctionPoolTask::_setup( const Image & in, uint32_t startXIn, uint32_t startYIn, uint32_t widthIn, uint32_t heightIn,
                                   Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t widthOut, uint32_t heightOut )
    {
        Image_Function::ParameterValidation( in, startXIn, startYIn, widthIn, heightIn );
        Image_Function::ParameterValidation( out, startXOut, startYOut, widthOut, heightOut );

        if( !_ready() )
            throw imageException( "FunctionTask object was called multiple times!" );

        _infoIn1 = std::unique_ptr < InputImageInfo  >( new InputImageInfo ( in, startXIn, startYIn, std::min( widthIn, widthOut ),
                                                                                                     std::min( heightIn, heightOut ), threadCount() ) );
        _infoOut = std::unique_ptr < OutputImageInfo >( new OutputImageInfo( out, startXOut, startYOut, widthOut, heightOut, threadCount() ) );

        _infoOut->_copy( *_infoIn1, startXOut, startYOut, widthOut, heightOut );
        _infoIn1->_copy( *_infoOut, startXIn, startYIn, widthIn, heightIn );
    }